

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O1

void __thiscall
mocker::detail::RegisterAllocator::rewriteProgram
          (RegisterAllocator *this,
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          *toBeSpilled)

{
  _func_int **pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *__n;
  element_type *peVar3;
  pointer psVar4;
  const_iterator cVar5;
  Section *pSVar6;
  pointer pcVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  Register *pRVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  char cVar13;
  int iVar14;
  mapped_type *pmVar15;
  const_iterator cVar16;
  long *plVar17;
  mapped_type *pmVar18;
  iterator iVar19;
  iterator iVar20;
  _Node *p_Var21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _List_node_base *p_Var22;
  ulong uVar23;
  iterator iVar24;
  long lVar25;
  RegisterAllocator *pRVar26;
  ulong __val;
  char cVar27;
  _func_int **pp_Var28;
  long lVar29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var30;
  long lVar31;
  pointer __k;
  BinaryInst *pBVar32;
  _List_node_base *p_Var33;
  bool bVar34;
  shared_ptr<mocker::nasm::BinaryInst> newSubRsp;
  shared_ptr<mocker::nasm::Inst> newInst;
  string __str;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> lines;
  shared_ptr<mocker::nasm::Inst> inst_2;
  RegSet s;
  shared_ptr<mocker::nasm::BinaryInst> inst_1;
  RegMap<std::shared_ptr<nasm::MemoryAddr>_> offsets;
  undefined1 local_288 [32];
  _List_node_base *local_268;
  RegisterAllocator *local_260;
  undefined1 local_251;
  shared_ptr<mocker::nasm::NumericConstant> local_250;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_240;
  shared_ptr<mocker::nasm::Mov> local_230;
  undefined1 local_220 [16];
  _List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> local_210;
  shared_ptr<mocker::nasm::Inst> local_1f8;
  undefined1 auStack_1e8 [64];
  Register *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1a0 [2];
  undefined1 local_190 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  Line local_118;
  Line *local_e8;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_e0;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c8;
  Line local_90;
  Line local_60;
  
  iVar24._M_node = (this->funcBeg)._M_node;
  local_268 = (_List_node_base *)toBeSpilled;
  local_260 = this;
  if ((this->funcEnd)._M_node != iVar24._M_node) {
    do {
      nasm::dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                ((nasm *)&local_c8,(shared_ptr<mocker::nasm::Inst> *)(iVar24._M_node + 3));
      if ((local_c8._M_buckets == (__buckets_ptr)0x0) || (*(int *)(local_c8._M_buckets + 1) != 4)) {
        bVar34 = false;
      }
      else {
        nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>
                  ((nasm *)auStack_1e8,(shared_ptr<mocker::nasm::Addr> *)(local_c8._M_buckets + 2));
        uVar9 = auStack_1e8._0_8_;
        if ((nasm::rsp()::res == '\0') &&
           (iVar14 = __cxa_guard_acquire(&nasm::rsp()::res), iVar14 != 0)) {
          nasm::rsp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::rsp::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::rsp::res,
                     (allocator<mocker::nasm::Register> *)local_190,(char (*) [4])"rsp");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::rsp::res,&__dso_handle);
          __cxa_guard_release(&nasm::rsp()::res);
        }
        __n = (((shared_ptr<mocker::nasm::Addr> *)
               &(((shared_ptr<mocker::nasm::Register> *)(uVar9 + 8))->
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
              ->super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (__n == (element_type *)
                   ((nasm::rsp::res.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->identifier)._M_string_length) {
          if (__n == (element_type *)0x0) {
            bVar34 = true;
          }
          else {
            iVar14 = bcmp((((shared_ptr<mocker::nasm::Register> *)(uVar9 + 8))->
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr,((nasm::rsp::res.
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->identifier)._M_dataplus._M_p,(size_t)__n);
            bVar34 = iVar14 == 0;
          }
        }
        else {
          bVar34 = false;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_bucket_count !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_bucket_count);
      }
    } while ((!bVar34) &&
            (iVar24._M_node = (iVar24._M_node)->_M_next,
            iVar24._M_node != (local_260->funcEnd)._M_node));
  }
  pRVar26 = local_260;
  local_c8._M_buckets = &local_c8._M_single_bucket;
  local_c8._M_bucket_count = 1;
  local_c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c8._M_element_count = 0;
  local_c8._M_rehash_policy._M_max_load_factor = 1.0;
  local_c8._M_rehash_policy._M_next_resize = 0;
  local_c8._M_single_bucket = (__node_base_ptr)0x0;
  p_Var22 = (local_260->funcEnd)._M_node;
  if (iVar24._M_node == p_Var22) {
    for (p_Var33 = (local_260->funcBeg)._M_node;
        (p_Var22 != p_Var33 && (p_Var33[3]._M_next == (_List_node_base *)0x0));
        p_Var33 = p_Var33->_M_next) {
    }
    p_Var22 = local_268->_M_prev;
    psVar4 = (((_Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                *)&local_268->_M_next)->_M_impl).super__Vector_impl_data._M_start;
    cVar5._M_node = p_Var33->_M_next->_M_next;
    local_288._0_4_ = 4;
    if ((nasm::rsp()::res == '\0') && (iVar14 = __cxa_guard_acquire(&nasm::rsp()::res), iVar14 != 0)
       ) {
      nasm::rsp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::rsp::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::rsp::res,(allocator<mocker::nasm::Register> *)local_190,
                 (char (*) [4])"rsp");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::rsp::res,&__dso_handle);
      __cxa_guard_release(&nasm::rsp()::res);
      pRVar26 = local_260;
    }
    local_190._0_8_ = (element_type *)0x0;
    local_190._8_8_ = operator_new(0x20);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_001efff8;
    local_190._0_8_ = local_190._8_8_ + 0x10;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_190._8_8_ + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0048;
    *(ulong *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_190._8_8_ + 0x10))->
               _M_use_count = ((long)p_Var22 - (long)psVar4 >> 1 & 0xfffffffffffffff7U) + 0x10;
    auStack_1e8._0_8_ = (MemoryAddr *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::nasm::BinaryInst,std::allocator<mocker::nasm::BinaryInst>,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_1e8 + 8),
               (BinaryInst **)auStack_1e8,(allocator<mocker::nasm::BinaryInst> *)&local_250,
               (OpType *)local_288,&nasm::rsp::res,
               (shared_ptr<mocker::nasm::NumericConstant> *)local_190);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
    }
    pSVar6 = pRVar26->section;
    local_158 = &local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(auStack_1e8._8_8_ + 8) = *(_Atomic_word *)(auStack_1e8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(auStack_1e8._8_8_ + 8) = *(_Atomic_word *)(auStack_1e8._8_8_ + 8) + 1;
      }
    }
    paVar2 = &local_90.label.field_2;
    if (local_158 == &local_148) {
      local_90.label.field_2._8_8_ = local_148._8_8_;
      local_90.label._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_90.label._M_dataplus._M_p = (pointer)local_158;
    }
    local_90.label.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
    local_90.label.field_2._M_local_buf[0] = local_148._M_local_buf[0];
    local_90.label._M_string_length = local_150;
    local_150 = 0;
    local_148._M_local_buf[0] = '\0';
    local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)auStack_1e8._0_8_;
    local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_;
    local_158 = &local_148;
    std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
    emplace<mocker::nasm::Line>(&pSVar6->lines,cVar5,&local_90);
    if (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.label._M_dataplus._M_p != paVar2) {
      operator_delete(local_90.label._M_dataplus._M_p,
                      local_90.label.field_2._M_allocated_capacity + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,
                      CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1)
      ;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_);
    }
    lVar29 = 0;
  }
  else {
    nasm::dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
              ((nasm *)local_190,(shared_ptr<mocker::nasm::Inst> *)(iVar24._M_node + 3));
    nasm::dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>const&>
              ((nasm *)auStack_1e8,(shared_ptr<mocker::nasm::Addr> *)(local_190._0_8_ + 0x20));
    peVar3 = (((shared_ptr<mocker::nasm::Register> *)(auStack_1e8._0_8_ + 8))->
             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_);
    }
    p_Var22 = local_268->_M_prev;
    psVar4 = (((_Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                *)&local_268->_M_next)->_M_impl).super__Vector_impl_data._M_start;
    auStack_1e8._0_8_ = (MemoryAddr *)(auStack_1e8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_1e8,iVar24._M_node[1]._M_next,
               (long)&(iVar24._M_node[1]._M_prev)->_M_next + (long)iVar24._M_node[1]._M_next);
    cVar5._M_node = (iVar24._M_node)->_M_next;
    std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_erase
              (&pRVar26->section->lines,iVar24);
    local_230.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(local_230.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ._4_4_,4);
    if ((nasm::rsp()::res == '\0') && (iVar14 = __cxa_guard_acquire(&nasm::rsp()::res), iVar14 != 0)
       ) {
      nasm::rsp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::rsp::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::rsp::res,(allocator<mocker::nasm::Register> *)&local_250,
                 (char (*) [4])"rsp");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::rsp::res,&__dso_handle);
      __cxa_guard_release(&nasm::rsp()::res);
      pRVar26 = local_260;
    }
    local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    lVar29 = (long)p_Var22 - (long)psVar4 >> 1;
    (local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count = 1;
    (local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_weak_count = 1;
    (local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_001efff8;
    local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0048;
    *(ulong *)&local_250.
               super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi[1]._M_use_count =
         (long)peVar3 + (lVar29 - (ulong)((uint)lVar29 & 8)) + 0x10;
    local_288._0_8_ = (BinaryInst *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::nasm::BinaryInst,std::allocator<mocker::nasm::BinaryInst>,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8),
               (BinaryInst **)local_288,(allocator<mocker::nasm::BinaryInst> *)&local_210,
               (OpType *)&local_230,&nasm::rsp::res,&local_250);
    if (local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_250.
                 super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pSVar6 = pRVar26->section;
    local_138 = &local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,auStack_1e8._0_8_,
               (undefined1 *)
               ((long)&((Inst *)auStack_1e8._0_8_)->_vptr_Inst +
               (long)(_func_int ***)auStack_1e8._8_8_));
    if ((BinaryInst *)local_288._8_8_ != (BinaryInst *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288._8_8_ + 8))->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288._8_8_ + 8))->_M_pi +
             1;
        UNLOCK();
      }
      else {
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288._8_8_ + 8))->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288._8_8_ + 8))->_M_pi +
             1;
      }
    }
    paVar2 = &local_60.label.field_2;
    if (local_138 == &local_128) {
      local_60.label.field_2._8_8_ = local_128._8_8_;
      local_60.label._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_60.label._M_dataplus._M_p = (pointer)local_138;
    }
    local_60.label.field_2._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
    local_60.label.field_2._M_local_buf[0] = local_128._M_local_buf[0];
    local_60.label._M_string_length = local_130;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_288._0_8_;
    local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
    local_138 = &local_128;
    std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
    emplace<mocker::nasm::Line>(&pSVar6->lines,cVar5,&local_60);
    if ((BinaryInst *)
        local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (BinaryInst *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.label._M_dataplus._M_p != paVar2) {
      operator_delete(local_60.label._M_dataplus._M_p,
                      local_60.label.field_2._M_allocated_capacity + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,
                      CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) + 1)
      ;
    }
    if ((BinaryInst *)local_288._8_8_ != (BinaryInst *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_);
    }
    if ((MemoryAddr *)auStack_1e8._0_8_ != (MemoryAddr *)(auStack_1e8 + 0x10)) {
      operator_delete((void *)auStack_1e8._0_8_,
                      (ulong)((long)(_Hash_node_base **)auStack_1e8._16_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
    }
    lVar29 = (long)(int)peVar3;
  }
  lVar25 = (long)local_268->_M_prev -
           (long)(((_Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)&local_268->_M_next)->_M_impl).super__Vector_impl_data._M_start;
  if (lVar25 != 0) {
    lVar25 = lVar25 >> 4;
    lVar25 = lVar25 + (ulong)(lVar25 == 0);
    lVar29 = -lVar29;
    lVar31 = 0;
    do {
      lVar29 = lVar29 + -8;
      if ((nasm::rbp()::res == '\0') &&
         (iVar14 = __cxa_guard_acquire(&nasm::rbp()::res), iVar14 != 0)) {
        nasm::rbp::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rbp::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rbp::res,
                   (allocator<mocker::nasm::Register> *)local_190,(char (*) [4])"rbp");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::rbp::res,&__dso_handle);
        __cxa_guard_release(&nasm::rbp()::res);
      }
      auStack_1e8._0_8_ = (element_type *)0x0;
      local_190._0_8_ = lVar29;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::MemoryAddr,std::allocator<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>const&,unsigned_long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_1e8 + 8),
                 (MemoryAddr **)auStack_1e8,(allocator<mocker::nasm::MemoryAddr> *)local_288,
                 &nasm::rbp::res,(unsigned_long *)local_190);
      pmVar15 = std::__detail::
                _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_c8,
                             (key_type *)
                             ((long)&(((((_Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                          *)&local_268->_M_next)->_M_impl).super__Vector_impl_data.
                                      _M_start)->
                                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar31));
      uVar10 = auStack_1e8._8_8_;
      uVar9 = auStack_1e8._0_8_;
      auStack_1e8._0_8_ = (MemoryAddr *)0x0;
      auStack_1e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var30 = (pmVar15->super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (pmVar15->super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)uVar9;
      (pmVar15->super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
      if (p_Var30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var30);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1e8._8_8_);
      }
      lVar31 = lVar31 + 0x10;
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
  }
  local_210._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_210;
  local_210._M_impl._M_node._M_size = 0;
  local_210._M_impl._M_node.super__List_node_base._M_prev =
       local_210._M_impl._M_node.super__List_node_base._M_next;
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Register>const*,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>>
            ((_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)auStack_1e8,
             (((_Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                *)&local_268->_M_next)->_M_impl).super__Vector_impl_data._M_start,local_268->_M_prev
             ,0,local_190,local_288,&local_250);
  p_Var22 = (local_260->funcBeg)._M_node;
  p_Var33 = (local_260->funcEnd)._M_node;
  if (p_Var33 != p_Var22) {
    __val = 0;
    do {
      local_1f8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (((_Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              *)&p_Var22[3]._M_next)->_M_impl).super__Vector_impl_data._M_start;
      local_1f8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var22[3]._M_prev)->_M_pi;
      if (local_1f8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1f8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1f8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1f8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_1f8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_268 = p_Var22;
      if ((element_type *)
          local_1f8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        p_Var21 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                  _M_create_node<mocker::nasm::Line_const&>
                            ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                             &local_210,(Line *)(p_Var22 + 1));
        std::__detail::_List_node_base::_M_hook(&p_Var21->super__List_node_base);
        local_210._M_impl._M_node._M_size =
             (long)(_func_int ***)local_210._M_impl._M_node._M_size + 1;
      }
      else {
        local_190._0_8_ = local_190 + 0x30;
        local_190._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        local_190._16_8_ = (_Hash_node_base *)0x0;
        local_190._24_8_ = 0;
        local_190._32_4_ = 1.0;
        local_190._40_8_ = 0;
        local_190._48_8_ = (__node_base_ptr)0x0;
        local_e8 = (Line *)(p_Var22 + 1);
        nasm::getInvolvedRegs(&local_e0,&local_1f8);
        psVar4 = local_e0.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__k = local_e0.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __k != psVar4; __k = __k + 1) {
          cVar16 = std::
                   _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)auStack_1e8,__k);
          if (cVar16.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>._M_cur
              != (__node_type *)0x0) {
            peVar3 = (__k->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)&local_240;
            pcVar7 = (peVar3->identifier)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_250,pcVar7,pcVar7 + (peVar3->identifier)._M_string_length);
            std::__cxx11::string::append((char *)&local_250);
            cVar27 = '\x01';
            if (9 < __val) {
              uVar23 = __val;
              cVar13 = '\x04';
              do {
                cVar27 = cVar13;
                if (uVar23 < 100) {
                  cVar27 = cVar27 + -2;
                  goto LAB_00134b5f;
                }
                if (uVar23 < 1000) {
                  cVar27 = cVar27 + -1;
                  goto LAB_00134b5f;
                }
                if (uVar23 < 10000) goto LAB_00134b5f;
                bVar34 = 99999 < uVar23;
                uVar23 = uVar23 / 10000;
                cVar13 = cVar27 + '\x04';
              } while (bVar34);
              cVar27 = cVar27 + '\x01';
            }
LAB_00134b5f:
            local_230.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_220;
            std::__cxx11::string::_M_construct((ulong)&local_230,cVar27);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_230.
                               super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,
                       (uint)local_230.
                             super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,__val);
            pp_Var28 = (_func_int **)0xf;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_250.
                super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != &local_240) {
              pp_Var28 = local_240._vptr__Sp_counted_base;
            }
            pp_Var1 = (_func_int **)
                      ((long)&(local_250.
                               super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                      CONCAT44(local_230.
                               super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._4_4_,
                               (uint)local_230.
                                     super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi));
            if (pp_Var28 < pp_Var1) {
              pp_Var28 = (_func_int **)0xf;
              if (local_230.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)local_220) {
                pp_Var28 = (_func_int **)local_220._0_8_;
              }
              if (pp_Var28 < pp_Var1) goto LAB_00134bcf;
              plVar17 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_230,0,(char *)0x0,
                                           (ulong)local_250.
                                                  super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
            }
            else {
LAB_00134bcf:
              plVar17 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_250,
                                           (ulong)local_230.
                                                  super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr);
            }
            local_288._0_8_ = local_288 + 0x10;
            pBVar32 = (BinaryInst *)(plVar17 + 2);
            if ((BinaryInst *)*plVar17 == pBVar32) {
              local_288._16_8_ =
                   ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                   &pBVar32->super_Inst)->_M_ptr;
              local_288._24_8_ = plVar17[3];
            }
            else {
              local_288._16_8_ =
                   ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                   &pBVar32->super_Inst)->_M_ptr;
              local_288._0_8_ = (BinaryInst *)*plVar17;
            }
            local_288._8_8_ = plVar17[1];
            *plVar17 = (long)pBVar32;
            plVar17[1] = 0;
            *(undefined1 *)
             &((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
              &pBVar32->super_Inst)->_M_ptr = 0;
            local_1a8 = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,std::__cxx11::string>
                      (a_Stack_1a0,&local_1a8,(allocator<mocker::nasm::Register> *)&local_251,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288);
            if ((BinaryInst *)local_288._0_8_ != (BinaryInst *)(local_288 + 0x10)) {
              operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
            }
            if (local_230.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)local_220) {
              operator_delete(local_230.
                              super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,local_220._0_8_ + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_250.
                super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != &local_240) {
              operator_delete(local_250.
                              super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(long)local_240._vptr__Sp_counted_base + 1);
            }
            pmVar18 = std::__detail::
                      _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_190,__k);
            _Var12._M_pi = a_Stack_1a0[0]._M_pi;
            pRVar11 = local_1a8;
            local_1a8 = (Register *)0x0;
            a_Stack_1a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var30 = (pmVar18->
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
            (pmVar18->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 = pRVar11;
            (pmVar18->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi = _Var12._M_pi;
            if (p_Var30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var30);
            }
            if (a_Stack_1a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1a0[0]._M_pi);
            }
            __val = __val + 1;
          }
        }
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::~vector(&local_e0);
        nasm::getUsedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           *)local_288,&local_1f8);
        uVar9 = local_288._8_8_;
        for (pBVar32 = (BinaryInst *)local_288._0_8_; pBVar32 != (BinaryInst *)uVar9;
            pBVar32 = (BinaryInst *)&pBVar32->lhs) {
          cVar16 = std::
                   _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)auStack_1e8,(key_type *)pBVar32);
          if (cVar16.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>._M_cur
              != (__node_type *)0x0) {
            iVar19 = std::
                     _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_190,(key_type *)pBVar32);
            if ((iVar19.
                 super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                 ._M_cur == (__node_type *)0x0) ||
               (iVar20 = std::
                         _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find(&local_c8,(key_type *)pBVar32),
               iVar20.
               super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_true>
               ._M_cur == (__node_type *)0x0)) {
              std::__throw_out_of_range("_Map_base::at");
            }
            local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Mov,std::allocator<mocker::nasm::Mov>,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::MemoryAddr>&>
                      (&local_250.
                        super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,(Mov **)&local_250,(allocator<mocker::nasm::Mov> *)&local_230,
                       (shared_ptr<mocker::nasm::Register> *)
                       ((long)iVar19.
                              super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                              ._M_cur + 0x18),
                       (shared_ptr<mocker::nasm::MemoryAddr> *)
                       ((long)iVar20.
                              super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_true>
                              ._M_cur + 0x18));
            p_Var21 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                      _M_create_node<std::shared_ptr<mocker::nasm::Mov>&>
                                ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                                 &local_210,(shared_ptr<mocker::nasm::Mov> *)&local_250);
            std::__detail::_List_node_base::_M_hook(&p_Var21->super__List_node_base);
            local_210._M_impl._M_node._M_size =
                 (long)(_func_int ***)local_210._M_impl._M_node._M_size + 1;
            if (local_250.
                super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_250.
                         super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
        }
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)local_288);
        nasm::replaceRegs((nasm *)&local_250,&local_1f8,
                          (RegMap<std::shared_ptr<Register>_> *)local_190);
        p_Var21 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                  _M_create_node<std::__cxx11::string_const&,std::shared_ptr<mocker::nasm::Inst>&>
                            ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                             &local_210,&local_e8->label,
                             (shared_ptr<mocker::nasm::Inst> *)&local_250);
        std::__detail::_List_node_base::_M_hook(&p_Var21->super__List_node_base);
        local_210._M_impl._M_node._M_size =
             (long)(_func_int ***)local_210._M_impl._M_node._M_size + 1;
        nasm::getDefinedRegs
                  ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)local_288,&local_1f8);
        uVar9 = local_288._8_8_;
        for (pBVar32 = (BinaryInst *)local_288._0_8_; pBVar32 != (BinaryInst *)uVar9;
            pBVar32 = (BinaryInst *)&pBVar32->lhs) {
          cVar16 = std::
                   _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)auStack_1e8,(key_type *)pBVar32);
          if (cVar16.super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>._M_cur
              != (__node_type *)0x0) {
            iVar20 = std::
                     _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&local_c8,(key_type *)pBVar32);
            if ((iVar20.
                 super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_true>
                 ._M_cur == (__node_type *)0x0) ||
               (iVar19 = std::
                         _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_190,(key_type *)pBVar32),
               iVar19.
               super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
               ._M_cur == (__node_type *)0x0)) {
              std::__throw_out_of_range("_Map_base::at");
            }
            local_230.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Mov,std::allocator<mocker::nasm::Mov>,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Register>&>
                      (&local_230.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Mov **)&local_230,(allocator<mocker::nasm::Mov> *)&local_e0,
                       (shared_ptr<mocker::nasm::MemoryAddr> *)
                       ((long)iVar20.
                              super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_true>
                              ._M_cur + 0x18),
                       (shared_ptr<mocker::nasm::Register> *)
                       ((long)iVar19.
                              super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                              ._M_cur + 0x18));
            p_Var21 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                      _M_create_node<std::shared_ptr<mocker::nasm::Mov>&>
                                ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                                 &local_210,&local_230);
            std::__detail::_List_node_base::_M_hook(&p_Var21->super__List_node_base);
            local_210._M_impl._M_node._M_size =
                 (long)(_func_int ***)local_210._M_impl._M_node._M_size + 1;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(local_230.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi._4_4_,
                         (uint)local_230.
                               super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(local_230.
                                  super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi._4_4_,
                                  (uint)local_230.
                                        super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi));
            }
          }
        }
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)local_288);
        if (local_250.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_250.
                     super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_190);
      }
      if (local_1f8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      p_Var22 = (_List_node_base *)
                (((_Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)&local_268->_M_next)->_M_impl).super__Vector_impl_data._M_start;
      p_Var33 = (local_260->funcEnd)._M_node;
    } while (p_Var22 != p_Var33);
  }
  pRVar26 = local_260;
  iVar24._M_node = (local_260->funcBeg)._M_node;
  if (iVar24._M_node != p_Var33) {
    pSVar6 = local_260->section;
    do {
      p_Var22 = (iVar24._M_node)->_M_next;
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_erase
                (&pSVar6->lines,iVar24);
      iVar24._M_node = p_Var22;
    } while (p_Var22 != p_Var33);
  }
  (pRVar26->funcEnd)._M_node = p_Var33;
  (pRVar26->funcBeg)._M_node = p_Var33;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_210._M_impl._M_node.super__List_node_base._M_next !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_210) {
    paVar2 = &local_118.label.field_2;
    bVar34 = false;
    p_Var30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_210._M_impl._M_node.super__List_node_base._M_next;
    do {
      pSVar6 = pRVar26->section;
      cVar5._M_node = (pRVar26->funcEnd)._M_node;
      p_Var8 = p_Var30 + 2;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var30[1]._vptr__Sp_counted_base ==
          p_Var8) {
        local_118.label.field_2._M_allocated_capacity = (size_type)p_Var8->_vptr__Sp_counted_base;
        local_118.label.field_2._8_8_ = *(undefined8 *)&p_Var30[2]._M_use_count;
        local_118.label._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_118.label.field_2._M_allocated_capacity = (size_type)p_Var8->_vptr__Sp_counted_base;
        local_118.label._M_dataplus._M_p = (pointer)p_Var30[1]._vptr__Sp_counted_base;
      }
      p_Var22 = *(_List_node_base **)&p_Var30[1]._M_use_count;
      p_Var30[1]._vptr__Sp_counted_base = (_func_int **)p_Var8;
      *(_List_node_base **)&p_Var30[1]._M_use_count = (_List_node_base *)0x0;
      *(undefined1 *)&p_Var30[2]._vptr__Sp_counted_base = 0;
      p_Var33 = (((_List_impl *)&p_Var30[3]._vptr__Sp_counted_base)->_M_node).super__List_node_base.
                _M_next;
      p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var30[3]._M_use_count;
      *(_List_node_base **)&p_Var30[3]._M_use_count = (_List_node_base *)0x0;
      (((_List_impl *)&p_Var30[3]._vptr__Sp_counted_base)->_M_node).super__List_node_base._M_next =
           (_List_node_base *)0x0;
      local_118.label._M_string_length = (size_type)p_Var22;
      local_118.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var33;
      local_118.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var8;
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
      emplace<mocker::nasm::Line>(&pSVar6->lines,cVar5,&local_118);
      if (local_118.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.label._M_dataplus._M_p != paVar2) {
        operator_delete(local_118.label._M_dataplus._M_p,
                        (ulong)(local_118.label.field_2._M_allocated_capacity + 1));
      }
      if (!bVar34) {
        (pRVar26->funcBeg)._M_node = ((pRVar26->funcBeg)._M_node)->_M_prev;
        bVar34 = true;
      }
      p_Var30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (((_List_impl *)&p_Var30->_vptr__Sp_counted_base)->_M_node).super__List_node_base.
                _M_next;
    } while (p_Var30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_210);
  }
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)auStack_1e8);
  std::__cxx11::_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_clear
            (&local_210);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::MemoryAddr>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8);
  return;
}

Assistant:

void RegisterAllocator::rewriteProgram(const std::vector<Node> &toBeSpilled) {
  // find sub rsp
  LineIter iter;
  for (iter = funcBeg; iter != funcEnd; ++iter) {
    auto inst = nasm::dyc<nasm::BinaryInst>(iter->inst);
    if (!inst || inst->getType() != nasm::BinaryInst::Sub)
      continue;
    auto reg = nasm::dyc<nasm::Register>(inst->getLhs());
    if (reg->getIdentifier() == nasm::rsp()->getIdentifier())
      break;
  }

  std::size_t baseOffset = 0;
  RegMap<std::shared_ptr<nasm::MemoryAddr>> offsets;

  // An sub-rsp instruction exists
  if (iter != funcEnd) {
    auto inst = nasm::dyc<nasm::BinaryInst>(iter->inst);
    baseOffset = nasm::dyc<nasm::NumericConstant>(inst->getRhs())->getVal();
    int64_t alignSz = baseOffset + 8 * toBeSpilled.size() +
                      (16 - (8 * toBeSpilled.size()) % 16);
    auto label = iter->label;
    auto pos = section.erase(iter);
    auto newSubRsp = std::make_shared<nasm::BinaryInst>(
        nasm::BinaryInst::Sub, nasm::rsp(),
        std::make_shared<nasm::NumericConstant>(alignSz));
    section.appendLine(pos, nasm::Line(label, newSubRsp));

  } else {
    for (iter = funcBeg; iter != funcEnd; ++iter) {
      if (iter->inst)
        break;
    }
    // The first two instructions of a function are always
    // push  %rbp
    // mov   %rbp, %rsp
    ++iter;
    ++iter;
    int64_t alignSz = baseOffset + 8 * toBeSpilled.size() +
                      (16 - (8 * toBeSpilled.size()) % 16);
    auto newSubRsp = std::make_shared<nasm::BinaryInst>(
        nasm::BinaryInst::Sub, nasm::rsp(),
        std::make_shared<nasm::NumericConstant>(alignSz));
    section.appendLine(iter, nasm::Line("", newSubRsp));
  }

  for (std::size_t i = 0, sz = toBeSpilled.size(); i < sz; ++i) {
    offsets[toBeSpilled[i]] = std::make_shared<nasm::MemoryAddr>(
        nasm::rbp(), -((int)baseOffset + 8 * (i + 1)));
  }

  std::size_t vRegCnt = 0;
  auto newVReg = [&vRegCnt](const std::string &hint) {
    return std::make_shared<nasm::Register>(hint + "_" +
                                            std::to_string(vRegCnt++));
  };
  std::list<nasm::Line> lines;
  RegSet s(toBeSpilled.begin(), toBeSpilled.end());
  for (iter = funcBeg; iter != funcEnd; ++iter) {
    auto inst = iter->inst;
    if (!inst) {
      lines.emplace_back(*iter);
      continue;
    }
    RegMap<Node> mp;
    for (auto &reg : nasm::getInvolvedRegs(inst)) {
      if (!isIn(s, reg))
        continue;
      mp[reg] = newVReg(reg->getIdentifier());
    }
    for (auto &reg : nasm::getUsedRegs(inst)) {
      if (!isIn(s, reg))
        continue;
      auto load = std::make_shared<nasm::Mov>(mp.at(reg), offsets.at(reg));
      lines.emplace_back(load);
    }
    auto newInst = nasm::replaceRegs(inst, mp);
    lines.emplace_back(iter->label, newInst);
    for (auto &reg : nasm::getDefinedRegs(inst)) {
      if (!isIn(s, reg))
        continue;
      auto storeBack = std::make_shared<nasm::Mov>(offsets.at(reg), mp.at(reg));
      lines.emplace_back(storeBack);
    }
  }

  funcBeg = funcEnd = section.erase(funcBeg, funcEnd);
  bool flag = false;
  for (auto &line : lines) {
    section.appendLine(funcEnd, std::move(line));
    if (!flag) {
      flag = true;
      --funcBeg;
    }
  }
}